

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAutoHandle.cxx
# Opt level: O0

ssize_t __thiscall
auto_async_t::send(auto_async_t *this,int __fd,void *__buf,size_t __n,int __flags)

{
  uv_async_s *handle;
  ssize_t extraout_RAX;
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> lock;
  auto_async_t *this_local;
  
  lock._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_18,&this->handleMutex);
  if ((this->super_auto_handle_<uv_async_s>).super_auto_handle_base_<uv_async_s>.handle !=
      (uv_async_s *)0x0) {
    handle = auto_handle_::operator_cast_to_uv_async_s_((auto_handle_ *)this);
    uv_async_send(handle);
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  return extraout_RAX;
}

Assistant:

void auto_async_t::send()
{
  std::lock_guard<std::mutex> lock(handleMutex);
  if (this->handle) {
    uv_async_send(*this);
  }
}